

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refutils.cc
# Opt level: O3

void lf::refinement::WriteMatlabLevel(MeshHierarchy *hier_mesh,size_type level,string *filename)

{
  MeshHierarchy *pMVar1;
  pointer pcVar2;
  size_type sVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *pvVar8;
  long lVar9;
  int iVar10;
  MeshHierarchy *pMVar11;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  ofstream file;
  char local_251;
  MeshHierarchy *local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_248;
  undefined1 local_240 [16];
  pointer local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_248 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(local_248._4_4_,level)
  ;
  iVar10 = (int)filename->_M_string_length;
  local_250 = hier_mesh;
  if ((((filename->_M_string_length & 0xfffffffe) != 0) &&
      (pcVar2 = (filename->_M_dataplus)._M_p, pcVar2[iVar10 - 2] != '.')) &&
     (pcVar2[iVar10 - 1] != 'm')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (filename,".m");
  }
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"function [PTPAR,EDPAR,CELLPAR] = ",0x21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
    local_240[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_240,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"% Parent data for a hybid 2D mesh",0x21);
    local_240[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_240,1);
    pMVar11 = local_250;
    sVar3 = (size_type)local_248;
    MeshHierarchy::getMesh((MeshHierarchy *)local_240,(size_type)local_250);
    pvVar8 = MeshHierarchy::ParentInfos(pMVar11,sVar3,2);
    uVar5 = (**(code **)(*(long *)CONCAT71(local_240._1_7_,local_240[0]) + 0x18))
                      ((long *)CONCAT71(local_240._1_7_,local_240[0]),2);
    if (uVar5 != 0) {
      iVar10 = 1;
      lVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"PTPAR(",6);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",:) = [",7);
        iVar6 = normalize_idx(*(glb_idx_t *)
                               ((long)&((pvVar8->
                                        super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->parent_index +
                               lVar9));
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," , ",3);
        iVar6 = normalize_idx(*(glb_idx_t *)
                               ((long)&((pvVar8->
                                        super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->child_number +
                               lVar9));
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];",2);
        local_251 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_251,1);
        lVar9 = lVar9 + 0x18;
        iVar10 = iVar10 + 1;
      } while ((ulong)uVar5 * 0x18 != lVar9);
    }
    pvVar8 = MeshHierarchy::ParentInfos(local_250,(size_type)local_248,1);
    uVar5 = (**(code **)(*(long *)CONCAT71(local_240._1_7_,local_240[0]) + 0x18))
                      ((long *)CONCAT71(local_240._1_7_,local_240[0]),1);
    if (uVar5 != 0) {
      iVar10 = 1;
      lVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"EDPAR(",6);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",:) = [",7);
        iVar6 = normalize_idx(*(glb_idx_t *)
                               ((long)&((pvVar8->
                                        super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->parent_index +
                               lVar9));
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," , ",3);
        iVar6 = normalize_idx(*(glb_idx_t *)
                               ((long)&((pvVar8->
                                        super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->child_number +
                               lVar9));
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];",2);
        local_251 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_251,1);
        lVar9 = lVar9 + 0x18;
        iVar10 = iVar10 + 1;
      } while ((ulong)uVar5 * 0x18 != lVar9);
    }
    pMVar11 = local_250;
    sVar3 = (size_type)local_248;
    pvVar8 = MeshHierarchy::ParentInfos(local_250,(size_type)local_248,0);
    local_248 = MeshHierarchy::RefinementEdges(pMVar11,sVar3);
    uVar5 = (**(code **)(*(long *)CONCAT71(local_240._1_7_,local_240[0]) + 0x18))
                      ((long *)CONCAT71(local_240._1_7_,local_240[0]),0);
    if (uVar5 != 0) {
      local_250 = (MeshHierarchy *)(ulong)uVar5;
      lVar9 = 3;
      pMVar11 = (MeshHierarchy *)0x0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"CELLPAR(",8);
        pMVar1 = (MeshHierarchy *)((long)&pMVar11->_vptr_MeshHierarchy + 1);
        poVar7 = (ostream *)std::ostream::operator<<(&local_230,(int)pMVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",:) = [",7);
        iVar10 = normalize_idx(*(glb_idx_t *)
                                ((long)(pvVar8->
                                       super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar9 * 4 + -4))
        ;
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," , ",3);
        iVar10 = normalize_idx(*(glb_idx_t *)
                                ((long)&((pvVar8->
                                         super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->parent_ptr +
                                lVar9 * 4));
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," , ",3);
        iVar10 = normalize_idx((local_248->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[(long)pMVar11]);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ];",3);
        local_251 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_251,1);
        lVar9 = lVar9 + 6;
        pMVar11 = pMVar1;
      } while (local_250 != pMVar1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)
   ((long)&local_230 +
   (long)_VTT[-2].super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
       = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void WriteMatlabLevel(const MeshHierarchy &hier_mesh, size_type level,
                      std::string filename) {
  // Preprocess filename: append .m, if not there already
  {
    const size_type fn_len = filename.size();
    if ((fn_len > 1) && (filename[fn_len - 2] != '.') &&
        (filename[fn_len - 1] != 'm')) {
      filename += ".m";
    }
  }
  // Open file for writing
  std::ofstream file(filename);
  if (file.is_open()) {
    // Start regular writing operations
    // Remove trailing .m
    filename.pop_back();
    filename.pop_back();
    file << "function [PTPAR,EDPAR,CELLPAR] = " << filename << "()" << '\n';
    file << "% Parent data for a hybid 2D mesh" << '\n';

    // Mesh on the selected level
    const std::shared_ptr<const mesh::Mesh> mesh = hier_mesh.getMesh(level);
    {
      // Output parent information for nodes
      const std::vector<ParentInfo> &pt_parent_info(
          hier_mesh.ParentInfos(level, 2));
      const size_type no_nodes = mesh->NumEntities(2);
      for (int k = 0; k < no_nodes; k++) {
        file << "PTPAR(" << k + 1 << ",:) = ["
             << normalize_idx(pt_parent_info[k].parent_index) << " , "
             << normalize_idx(pt_parent_info[k].child_number) << "];" << '\n';
      }
    }

    {
      // Output parent information for edge
      const std::vector<ParentInfo> &ed_parent_info(
          hier_mesh.ParentInfos(level, 1));
      const size_type no_edges = mesh->NumEntities(1);
      for (int k = 0; k < no_edges; k++) {
        file << "EDPAR(" << k + 1 << ",:) = ["
             << normalize_idx(ed_parent_info[k].parent_index) << " , "
             << normalize_idx(ed_parent_info[k].child_number) << "];" << '\n';
      }
    }

    {
      // Output parent information for cells
      const std::vector<ParentInfo> &cell_parent_info(
          hier_mesh.ParentInfos(level, 0));
      const std::vector<glb_idx_t> &ref_eds(hier_mesh.RefinementEdges(level));
      const size_type no_cells = mesh->NumEntities(0);
      for (int k = 0; k < no_cells; k++) {
        file << "CELLPAR(" << k + 1 << ",:) = ["
             << normalize_idx(cell_parent_info[k].parent_index) << " , "
             << normalize_idx(cell_parent_info[k].child_number) << " , "
             << normalize_idx(ref_eds[k]) << " ];" << '\n';
      }
    }
  }
}